

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O0

void __thiscall
fmcalc::dofm(fmcalc *this,int event_id,vector<int,_std::allocator<int>_> *items,
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *event_guls)

{
  float fVar1;
  value_type vVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  const_reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  reference this_00;
  reference pvVar15;
  ulong uVar16;
  reference piVar17;
  reference pvVar18;
  reference pvVar19;
  uint *puVar20;
  const_reference pvVar21;
  const_reference pvVar22;
  const_reference pvVar23;
  reference pvVar24;
  reference __ptr;
  undefined4 local_270;
  undefined4 local_26c;
  fmlevelrec r;
  fmlevelrec *y;
  const_iterator __end2;
  const_iterator __begin2;
  vector<fmlevelrec,_std::allocator<fmlevelrec>_> *__range2;
  pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_> *x_2;
  iterator __end1;
  iterator __begin1;
  map<int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
  *__range1;
  int vid;
  int agg_id_2;
  uint i_4;
  int vec_idx;
  int last_agg_id;
  uint i_3;
  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
  *avx_1;
  vector<float,_std::allocator<float>_> *guls_1;
  undefined1 local_1f8 [4];
  uint gul_idx;
  map<int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
  outmap;
  vector<LossRec,_std::allocator<LossRec>_> *agg_vec;
  int i_2;
  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
  agg_vecs;
  iterator iStack_198;
  int x_1;
  iterator __end6_1;
  iterator __begin6_1;
  vector<int,_std::allocator<int>_> *__range6_1;
  uint layer_1;
  int x;
  iterator __end6;
  iterator __begin6;
  vector<int,_std::allocator<int>_> *__range6;
  size_t current_idx_2;
  undefined1 local_150 [4];
  int policytc_id;
  policytcvidx a_1;
  uint layer;
  int current_idx_1;
  int agg_id_1;
  uint i_1;
  int previous_layer;
  reference pvStack_108;
  int size_1;
  vector<int,_std::allocator<int>_> *zzaggid_to_vectorlookup;
  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
  *next;
  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
  *prev;
  int local_e8;
  uint zzlevel;
  undefined1 local_e0 [8];
  policytcvidx a;
  int current_idx;
  int agg_id;
  uint i;
  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
  *avx;
  value_type *guls;
  undefined1 local_90 [4];
  int total_loss_items;
  vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  avxs;
  value_type_conflict local_70;
  int layer_id;
  reference pvStack_68;
  int size;
  vector<int,_std::allocator<int>_> *aggid_to_vectorlookup;
  allocator<std::vector<int,_std::allocator<int>_>_> local_49;
  undefined1 local_48 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  aggid_to_vectorlookups;
  int level;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *event_guls_local;
  vector<int,_std::allocator<int>_> *items_local;
  fmcalc *pfStack_10;
  int event_id_local;
  fmcalc *this_local;
  
  aggid_to_vectorlookups.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  iVar3 = this->maxLevel_;
  items_local._4_4_ = event_id;
  pfStack_10 = this;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_49);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_48,(long)(iVar3 + 1),&local_49);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_49);
  pvStack_68 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_48,0);
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->level_to_maxagg_id_,0);
  layer_id = *pvVar7;
  if (layer_id == -1) {
    fprintf(_stderr,"FATAL: Error: Possible level %d not initialized\n",0);
    exit(-1);
  }
  local_70 = -2;
  std::vector<int,_std::allocator<int>_>::resize(pvStack_68,(long)layer_id,&local_70);
  avxs.
  super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  std::
  vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
            *)local_90);
  guls._4_4_ = 0;
  std::
  vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
            *)local_90,(long)(this->maxLevel_ + 1));
  sVar8 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::size(event_guls);
  if (sVar8 != 0) {
    pvVar9 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](event_guls,0);
    pvVar10 = std::
              vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
              ::operator[]((vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                            *)local_90,0);
    std::
    vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
    ::resize(pvVar10,(long)(this->max_layer_ + 1));
    for (current_idx = 0; sVar8 = std::vector<float,_std::allocator<float>_>::size(pvVar9),
        (uint)current_idx < sVar8; current_idx = current_idx + 1) {
      pvVar11 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->pfm_vec_vec_,0);
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](items,(ulong)(uint)current_idx);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar11,(long)*pvVar12);
      iVar3 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_68,(long)(iVar3 + -1));
      a.item_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = *pvVar7;
      if (a.item_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ == -2) {
        policytcvidx::policytcvidx((policytcvidx *)local_e0);
        local_e0._4_4_ = iVar3;
        pvVar13 = std::
                  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                  ::operator[](&this->policy_tc_vec_vec_vec_,0);
        pvVar11 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](pvVar13,(long)iVar3);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar11,1);
        local_e0._0_4_ = *pvVar7;
        pvVar14 = std::
                  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                  ::operator[](pvVar10,1);
        std::vector<policytcvidx,_std::allocator<policytcvidx>_>::push_back
                  (pvVar14,(policytcvidx *)local_e0);
        pvVar14 = std::
                  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                  ::operator[](pvVar10,1);
        this_00 = std::
                  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                  ::operator[](pvVar10,1);
        sVar8 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::size(this_00);
        pvVar15 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::operator[]
                            (pvVar14,sVar8 - 1);
        zzlevel = current_idx;
        std::vector<int,_std::allocator<int>_>::push_back
                  (&pvVar15->item_idx,(value_type_conflict *)&zzlevel);
        pvVar14 = std::
                  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                  ::operator[](pvVar10,1);
        sVar8 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::size(pvVar14);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_68,(long)(iVar3 + -1));
        *pvVar7 = (int)sVar8 + -1;
        guls._4_4_ = guls._4_4_ + 1;
        policytcvidx::~policytcvidx((policytcvidx *)local_e0);
      }
      else {
        pvVar14 = std::
                  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                  ::operator[](pvVar10,1);
        pvVar15 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::operator[]
                            (pvVar14,(long)a.item_idx.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        local_e8 = current_idx;
        std::vector<int,_std::allocator<int>_>::push_back(&pvVar15->item_idx,&local_e8);
      }
    }
    for (prev._4_4_ = 1; uVar16 = (ulong)prev._4_4_,
        sVar8 = std::
                vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                ::size((vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                        *)local_90), uVar16 < sVar8; prev._4_4_ = prev._4_4_ + 1) {
      next = std::
             vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                           *)local_90,(ulong)(prev._4_4_ - 1));
      zzaggid_to_vectorlookup =
           (vector<int,_std::allocator<int>_> *)
           std::
           vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
           ::operator[]((vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                         *)local_90,(ulong)prev._4_4_);
      std::
      vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
      ::resize((vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                *)zzaggid_to_vectorlookup,(long)(this->max_layer_ + 1));
      pvStack_108 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)local_48,(ulong)prev._4_4_);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->level_to_maxagg_id_,(ulong)prev._4_4_);
      previous_layer = *pvVar7;
      if (previous_layer == -1) {
        fprintf(_stderr,"FATAL:Error possible level %d not initialized\n",(ulong)prev._4_4_);
        exit(-1);
      }
      i_1 = 0xfffffffe;
      std::vector<int,_std::allocator<int>_>::resize
                (pvStack_108,(long)previous_layer,(value_type_conflict *)&i_1);
      current_idx_1 = 0;
      while( true ) {
        pvVar14 = std::
                  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                  ::operator[](next,1);
        sVar8 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::size(pvVar14);
        if (sVar8 <= (uint)current_idx_1) break;
        pvVar11 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->pfm_vec_vec_,(ulong)prev._4_4_);
        pvVar14 = std::
                  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                  ::operator[](next,1);
        pvVar15 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::operator[]
                            (pvVar14,(ulong)(uint)current_idx_1);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar11,(long)pvVar15->agg_id);
        iVar3 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_108,(long)(iVar3 + -1));
        iVar4 = *pvVar7;
        if (iVar4 == -2) {
          a_1.item_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._4_4_ = 1;
          while( true ) {
            uVar16 = (ulong)a_1.item_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_;
            pvVar13 = std::
                      vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                      ::operator[](&this->policy_tc_vec_vec_vec_,(ulong)prev._4_4_);
            pvVar11 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](pvVar13,(long)iVar3);
            sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar11);
            if (sVar8 <= uVar16) break;
            policytcvidx::policytcvidx((policytcvidx *)local_150);
            pvVar13 = std::
                      vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                      ::operator[](&this->policy_tc_vec_vec_vec_,(ulong)prev._4_4_);
            pvVar11 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](pvVar13,(long)iVar3);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar11,(ulong)a_1.item_idx.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_end_of_storage._4_4_);
            local_150 = (undefined1  [4])*pvVar7;
            policytc_id = iVar3;
            pvVar14 = std::
                      vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                      ::operator[]((vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                    *)zzaggid_to_vectorlookup,
                                   (ulong)a_1.item_idx.super__Vector_base<int,_std::allocator<int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            std::vector<policytcvidx,_std::allocator<policytcvidx>_>::push_back
                      (pvVar14,(policytcvidx *)local_150);
            pvVar14 = std::
                      vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                      ::operator[]((vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                    *)zzaggid_to_vectorlookup,
                                   (ulong)a_1.item_idx.super__Vector_base<int,_std::allocator<int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            sVar8 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::size(pvVar14);
            pvVar14 = std::
                      vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                      ::operator[](next,1);
            pvVar15 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::operator[]
                                (pvVar14,(ulong)(uint)current_idx_1);
            __end6 = std::vector<int,_std::allocator<int>_>::begin(&pvVar15->item_idx);
            _layer_1 = std::vector<int,_std::allocator<int>_>::end(&pvVar15->item_idx);
            while (bVar6 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                               *)&layer_1), bVar6) {
              piVar17 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&__end6);
              __range6_1._4_4_ = *piVar17;
              pvVar14 = std::
                        vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                        ::operator[]((vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                      *)zzaggid_to_vectorlookup,
                                     (ulong)a_1.item_idx.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage._4_4_);
              pvVar15 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::operator[]
                                  (pvVar14,sVar8 - 1);
              std::vector<int,_std::allocator<int>_>::push_back
                        (&pvVar15->item_idx,(value_type_conflict *)((long)&__range6_1 + 4));
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end6);
            }
            pvVar14 = std::
                      vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                      ::operator[]((vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                    *)zzaggid_to_vectorlookup,
                                   (ulong)a_1.item_idx.super__Vector_base<int,_std::allocator<int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            sVar8 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::size(pvVar14);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (pvStack_108,(long)(iVar3 + -1));
            *pvVar7 = (int)sVar8 + -1;
            policytcvidx::~policytcvidx((policytcvidx *)local_150);
            a_1.item_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ =
                 a_1.item_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          }
        }
        else {
          __range6_1._0_4_ = 1;
          while( true ) {
            uVar16 = (ulong)(uint)__range6_1;
            pvVar13 = std::
                      vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                      ::operator[](&this->policy_tc_vec_vec_vec_,(ulong)prev._4_4_);
            pvVar11 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](pvVar13,(long)iVar3);
            sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar11);
            if (sVar8 <= uVar16) break;
            pvVar14 = std::
                      vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                      ::operator[](next,1);
            pvVar15 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::operator[]
                                (pvVar14,(ulong)(uint)current_idx_1);
            __end6_1 = std::vector<int,_std::allocator<int>_>::begin(&pvVar15->item_idx);
            iStack_198 = std::vector<int,_std::allocator<int>_>::end(&pvVar15->item_idx);
            while (bVar6 = __gnu_cxx::operator!=(&__end6_1,&stack0xfffffffffffffe68), bVar6) {
              piVar17 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&__end6_1);
              agg_vecs.
              super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = *piVar17;
              pvVar14 = std::
                        vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                        ::operator[]((vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                      *)zzaggid_to_vectorlookup,(ulong)(uint)__range6_1);
              pvVar15 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::operator[]
                                  (pvVar14,(long)iVar4);
              std::vector<int,_std::allocator<int>_>::push_back
                        (&pvVar15->item_idx,
                         (value_type_conflict *)
                         ((long)&agg_vecs.
                                 super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end6_1);
            }
            __range6_1._0_4_ = (uint)__range6_1 + 1;
          }
        }
        current_idx_1 = current_idx_1 + 1;
      }
    }
  }
  iVar3 = this->maxLevel_;
  std::
  allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>
  ::allocator((allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>
               *)((long)&agg_vec + 7));
  std::
  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
            *)&i_2,(long)(iVar3 + 1),
           (allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>
            *)((long)&agg_vec + 7));
  std::
  allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>
                *)((long)&agg_vec + 7));
  for (agg_vec._0_4_ = 0; (int)agg_vec < this->maxLevel_ + 1; agg_vec._0_4_ = (int)agg_vec + 1) {
    pvVar18 = std::
              vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
              ::operator[]((vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                            *)&i_2,(long)(int)agg_vec);
    std::
    vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
    ::resize(pvVar18,(long)(this->max_layer_ + 1));
  }
  pvVar18 = std::
            vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
            ::operator[]((vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                          *)&i_2,0);
  outmap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
               ::operator[](pvVar18,1);
  std::
  map<int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
  ::map((map<int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
         *)local_1f8);
  for (guls_1._4_4_ = 0;
      sVar8 = std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::size(event_guls), guls_1._4_4_ < sVar8; guls_1._4_4_ = guls_1._4_4_ + 1) {
    pvVar9 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](event_guls,(ulong)guls_1._4_4_);
    if ((guls_1._4_4_ < 2) || (bVar6 = gulhasvalue(this,pvVar9), bVar6)) {
      std::vector<LossRec,_std::allocator<LossRec>_>::resize
                ((vector<LossRec,_std::allocator<LossRec>_> *)
                 outmap._M_t._M_impl.super__Rb_tree_header._M_node_count,(long)guls._4_4_);
      pvVar10 = std::
                vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                ::operator[]((vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                              *)local_90,0);
      for (vec_idx = 0;
          sVar8 = std::vector<LossRec,_std::allocator<LossRec>_>::size
                            ((vector<LossRec,_std::allocator<LossRec>_> *)
                             outmap._M_t._M_impl.super__Rb_tree_header._M_node_count),
          (uint)vec_idx < sVar8; vec_idx = vec_idx + 1) {
        pvVar19 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                            ((vector<LossRec,_std::allocator<LossRec>_> *)
                             outmap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (ulong)(uint)vec_idx);
        pvVar19->loss = 0.0;
      }
      i_4 = 0xffffffff;
      agg_id_2 = 0;
      for (vid = 0; sVar8 = std::vector<float,_std::allocator<float>_>::size(pvVar9),
          (uint)vid < sVar8; vid = vid + 1) {
        pvVar11 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->pfm_vec_vec_,0);
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](items,(ulong)(uint)vid);
        puVar20 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar11,(long)*pvVar12)
        ;
        uVar5 = *puVar20;
        if (i_4 != uVar5) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (pvStack_68,(long)(int)(uVar5 - 1));
          agg_id_2 = *pvVar7;
          i_4 = uVar5;
        }
        pvVar21 = std::vector<float,_std::allocator<float>_>::operator[](pvVar9,(ulong)(uint)vid);
        fVar1 = *pvVar21;
        pvVar19 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                            ((vector<LossRec,_std::allocator<LossRec>_> *)
                             outmap._M_t._M_impl.super__Rb_tree_header._M_node_count,(long)agg_id_2)
        ;
        pvVar19->loss = fVar1 + pvVar19->loss;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (pvStack_68,(long)(int)(uVar5 - 1));
        iVar3 = *pvVar7;
        pvVar22 = std::
                  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                  ::operator[](pvVar10,1);
        pvVar23 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::operator[]
                            (pvVar22,(long)iVar3);
        iVar4 = pvVar23->agg_id;
        pvVar19 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                            ((vector<LossRec,_std::allocator<LossRec>_> *)
                             outmap._M_t._M_impl.super__Rb_tree_header._M_node_count,(long)agg_id_2)
        ;
        pvVar19->agg_id = iVar4;
        pvVar22 = std::
                  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                  ::operator[](pvVar10,1);
        pvVar23 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::operator[]
                            (pvVar22,(long)iVar3);
        pvVar19 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                            ((vector<LossRec,_std::allocator<LossRec>_> *)
                             outmap._M_t._M_impl.super__Rb_tree_header._M_node_count,(long)agg_id_2)
        ;
        pvVar19->item_idx = &pvVar23->item_idx;
        if ((this->isGULStreamType_ & 1U) == 1) {
          pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](items,(ulong)(uint)vid);
          pvVar24 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&this->item_to_tiv_,(long)*pvVar12);
          vVar2 = *pvVar24;
          pvVar19 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                              ((vector<LossRec,_std::allocator<LossRec>_> *)
                               outmap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (long)agg_id_2);
          pvVar19->accumulated_tiv = vVar2;
        }
        else {
          pvVar19 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                              ((vector<LossRec,_std::allocator<LossRec>_> *)
                               outmap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (long)agg_id_2);
          pvVar19->accumulated_tiv = 0.0;
        }
        pvVar22 = std::
                  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                  ::operator[](pvVar10,1);
        pvVar23 = std::vector<policytcvidx,_std::allocator<policytcvidx>_>::operator[]
                            (pvVar22,(long)iVar3);
        iVar3 = pvVar23->policytc_id;
        pvVar19 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                            ((vector<LossRec,_std::allocator<LossRec>_> *)
                             outmap._M_t._M_impl.super__Rb_tree_header._M_node_count,(long)agg_id_2)
        ;
        pvVar19->policytc_id = iVar3;
      }
      dofmcalc_r(this,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)local_48,
                 (vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                  *)&i_2,1,this->maxLevel_,
                 (map<int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
                  *)local_1f8,guls_1._4_4_,
                 (vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                  *)local_90,1,items,event_guls,1);
      std::vector<LossRec,_std::allocator<LossRec>_>::clear
                ((vector<LossRec,_std::allocator<LossRec>_> *)
                 outmap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)local_48);
  __end1 = std::
           map<int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
           ::begin((map<int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
                    *)local_1f8);
  x_2 = (pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_> *)
        std::
        map<int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
        ::end((map<int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
               *)local_1f8);
  while (bVar6 = std::operator!=(&__end1,(_Self *)&x_2), bVar6) {
    __ptr = std::
            _Rb_tree_iterator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>
            ::operator*(&__end1);
    fwrite((void *)((long)&items_local + 4),4,1,_stdout);
    fwrite(__ptr,4,1,_stdout);
    __end2 = std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>::begin(&__ptr->second);
    y = (fmlevelrec *)std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>::end(&__ptr->second);
    while (bVar6 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_fmlevelrec_*,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>
                                       *)&y), bVar6) {
      r = (fmlevelrec)
          __gnu_cxx::
          __normal_iterator<const_fmlevelrec_*,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>
          ::operator*(&__end2);
      fwrite((void *)r,8,1,_stdout);
      __gnu_cxx::
      __normal_iterator<const_fmlevelrec_*,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>::
      operator++(&__end2);
    }
    local_270 = 0;
    local_26c = 0;
    fwrite(&local_270,8,1,_stdout);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>
    ::operator++(&__end1);
  }
  std::
  map<int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
  ::~map((map<int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
          *)local_1f8);
  std::
  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
             *)&i_2);
  std::
  vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
             *)local_90);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_48);
  return;
}

Assistant:

void fmcalc::dofm(int event_id, const std::vector<int> &items, std::vector<vector<OASIS_FLOAT>> &event_guls)
{
	
	const int level = 0;
	std::vector<std::vector<int>>  aggid_to_vectorlookups(maxLevel_ + 1);

	std::vector<int> &aggid_to_vectorlookup = aggid_to_vectorlookups[level];	
	int size = level_to_maxagg_id_[level];
	if (size == -1) {
		fprintf(stderr, "FATAL: Error: Possible level %d not initialized\n", level);
		exit(-1);
	}
	else {
		aggid_to_vectorlookup.resize(size, -2);
	}

	const int layer_id = 1;
	std::vector<std::vector<std::vector<policytcvidx>>> avxs;
	int total_loss_items = 0;
    avxs.resize(maxLevel_ + 1);
	if (event_guls.size() > 0) {
		auto &guls = event_guls[0];		// pick any set of events they'll all have the same size we just want the size
		std::vector<std::vector<policytcvidx>> &avx = avxs[level];

		avx.resize(max_layer_+1);
		for (unsigned int i = 0;i < guls.size();i++) {
			int agg_id = pfm_vec_vec_[level][items[i]];

			int current_idx = aggid_to_vectorlookup[agg_id-1];
			if (current_idx == -2) {
				policytcvidx a;
				a.agg_id = agg_id;
				a.policytc_id = policy_tc_vec_vec_vec_[level][agg_id][layer_id];
				avx[layer_id].push_back(a);			// populate the first layer
				avx[layer_id][avx[layer_id].size() - 1].item_idx.push_back(i);
				aggid_to_vectorlookup[agg_id-1] = (int) avx[layer_id].size() - 1;
				total_loss_items++;
			}
			else {
				avx[layer_id][current_idx].item_idx.push_back(i);
			}
			
		}
		       
		for (unsigned int zzlevel = 1;zzlevel < avxs.size();zzlevel++) {
			std::vector<std::vector<policytcvidx>>  &prev = avxs[zzlevel-1];
			std::vector<std::vector<policytcvidx>>  &next = avxs[zzlevel];
			next.resize(max_layer_ + 1);

			std::vector<int> &zzaggid_to_vectorlookup = aggid_to_vectorlookups[zzlevel]; // 
			int size = level_to_maxagg_id_[zzlevel];
			if (size == -1) {
				fprintf(stderr, "FATAL:Error possible level %d not initialized\n", zzlevel);
				exit(-1);
			}
			else {
				zzaggid_to_vectorlookup.resize(size, -2);
			}
			
			int previous_layer = 1; // previous layer is always one because only the last layer can be greater than 1

			for (unsigned int i = 0;i < prev[previous_layer].size();i++) {
				int agg_id = pfm_vec_vec_[zzlevel][prev[previous_layer][i].agg_id];
				int current_idx = zzaggid_to_vectorlookup[agg_id-1];
				if (current_idx == -2)		// field not initialized
				{

					for (unsigned int layer = 1; layer < policy_tc_vec_vec_vec_[zzlevel][agg_id].size() ; layer++ ){ // loop through layers
						struct policytcvidx a;
						const int policytc_id = policy_tc_vec_vec_vec_[zzlevel][agg_id][layer];

						a.agg_id = agg_id;
						a.policytc_id = policytc_id;

						next[layer].push_back(a);
						
						size_t current_idx = next[layer].size() - 1;
						for (int x : prev[previous_layer][i].item_idx) {
							next[layer][current_idx].item_idx.push_back(x);	
						}
						zzaggid_to_vectorlookup[agg_id-1] = (int) next[layer].size() - 1; // temp use for getting 
					}						
				}
				else {
					for (unsigned int layer = 1; layer < policy_tc_vec_vec_vec_[zzlevel][agg_id].size(); layer++) { // loop through layers
						//const int policytc_id = policy_tc_vec_vec_vec_[zzlevel][agg_id][layer];
						for (int x : prev[previous_layer][i].item_idx) {
							next[layer][current_idx].item_idx.push_back(x);	
						}
					}

				}
			}
		}
	}

	vector<vector<vector <LossRec>>>agg_vecs(maxLevel_ + 1);
	for (int i = 0; i < maxLevel_ + 1; i++) {
		agg_vecs[i].resize(max_layer_ + 1);
	}
	vector <LossRec> &agg_vec = agg_vecs[level][layer_id];
	std::map<int, std::vector<fmlevelrec>> outmap;
	
	for (unsigned int gul_idx = 0; gul_idx < event_guls.size(); gul_idx++) {    // loop sample + 1 times
		const std::vector<OASIS_FLOAT>& guls = event_guls[gul_idx];
		if (gul_idx < 2 || gulhasvalue(guls)) {
			agg_vec.resize(total_loss_items);
			//fmlevelhdr fmhdr;
			//fmhdr.event_id = event_id;
			const std::vector<std::vector<policytcvidx>> &avx = avxs[level];
			for (unsigned int i = 0; i < agg_vec.size(); i++) agg_vec[i].loss = 0;
			int last_agg_id = -1;
			int vec_idx = 0;
			for (unsigned int i = 0; i < guls.size(); i++) {
				int agg_id = pfm_vec_vec_[level][items[i]];
				if (last_agg_id != agg_id) {
					vec_idx = aggid_to_vectorlookup[agg_id - 1];
					last_agg_id = agg_id;
				}
				agg_vec[vec_idx].loss += guls[i];
				int vid = aggid_to_vectorlookup[agg_id - 1];
				agg_vec[vec_idx].agg_id = avx[1][vid].agg_id;
				agg_vec[vec_idx].item_idx = &avx[1][vid].item_idx;
				if (isGULStreamType_ == true) {
				    agg_vec[vec_idx].accumulated_tiv = item_to_tiv_[items[i]];
				} else agg_vec[vec_idx].accumulated_tiv = 0;
				agg_vec[vec_idx].policytc_id = avx[1][vid].policytc_id;
			}
			
			dofmcalc_r(aggid_to_vectorlookups, agg_vecs, level + 1, maxLevel_, outmap, gul_idx, avxs, 1, items, event_guls,1);

			agg_vec.clear();
		}
	}
	aggid_to_vectorlookups.clear();
	// Do output
	for (const auto &x : outmap) {
		fwrite(&event_id, sizeof(event_id), 1, stdout);
		fwrite(&x.first, sizeof(x.first), 1, stdout);
		for (const auto &y : x.second) {
			fwrite(&y, sizeof(y), 1, stdout);
		}
		fmlevelrec r;
		r.sidx = 0;
		r.loss = 0;
		fwrite(&r, sizeof(r), 1, stdout); // terminate rows
	}
}